

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

void file_free_register(_7zip_conflict *zip)

{
  long in_RDI;
  file *file_next;
  file *file;
  undefined8 local_10;
  
  local_10 = *(long *)(in_RDI + 0xf110);
  while (local_10 != 0) {
    local_10 = *(long *)(local_10 + 0x18);
    file_free((file *)0x187389);
  }
  return;
}

Assistant:

static void
file_free_register(struct _7zip *zip)
{
	struct file *file, *file_next;

	file = zip->file_list.first;
	while (file != NULL) {
		file_next = file->next;
		file_free(file);
		file = file_next;
	}
}